

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall
Database::DatabaseImpl::GetTraffic
          (DatabaseImpl *this,string *port,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *time,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *traffic)

{
  bool bVar1;
  socklen_t __len;
  Column CStack_e8;
  string local_c8;
  Statement query;
  
  __len = (socklen_t)traffic;
  SQLite::Statement::Statement(&query,&this->db_,"SELECT * FROM traffic WHERE port = @port");
  SQLite::Statement::bind(&query,0x174143,(sockaddr *)port,__len);
  while( true ) {
    bVar1 = SQLite::Statement::executeStep(&query);
    if (!bVar1) break;
    SQLite::Statement::getColumn(&CStack_e8,&query,1);
    SQLite::Column::getString_abi_cxx11_(&local_c8,&CStack_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)time,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    SQLite::Column::~Column(&CStack_e8);
    SQLite::Statement::getColumn(&CStack_e8,&query,2);
    SQLite::Column::getString_abi_cxx11_(&local_c8,&CStack_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)traffic,
               &local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    SQLite::Column::~Column(&CStack_e8);
  }
  SQLite::Statement::~Statement(&query);
  return;
}

Assistant:

void Database::DatabaseImpl::GetTraffic(const string& port, vector<string>& time, vector<string>& traffic)
{
    SQLite::Statement query(db_, "SELECT * FROM traffic WHERE port = @port");
    query.bind("@port", port);
    while(query.executeStep()) {
        time.push_back(query.getColumn(1));
        traffic.push_back(query.getColumn(2));
    }
}